

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

void __thiscall
rlottie::internal::renderer::Group::addChildren(Group *this,Group *data,VArenaAlloc *allocator)

{
  bool bVar1;
  size_type in_RDX;
  vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
  *in_RSI;
  vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
  *in_RDI;
  VArenaAlloc *in_stack_00000010;
  Object *content;
  const_reverse_iterator it;
  pointer *in_stack_ffffffffffffffc0;
  vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
  *in_stack_ffffffffffffffd0;
  
  if (in_RSI != (vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
                 *)0x0) {
    bVar1 = std::
            vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
            ::empty(in_stack_ffffffffffffffd0);
    if (!bVar1) {
      in_stack_ffffffffffffffc0 =
           &(in_RDI->
            super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
      std::
      vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
      ::size((vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
              *)&(in_RSI->
                 super__Vector_base<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
      ::reserve(in_RSI,in_RDX);
    }
    std::
    vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
    ::crbegin(in_RDI);
    while( true ) {
      std::
      vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
      ::rend(in_RDI);
      bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<rlottie::internal::model::Object_*const_*,_std::vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>_>_>
                               *)in_stack_ffffffffffffffd0,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<rlottie::internal::model::Object_**,_std::vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>_>_>
                               *)in_RDI);
      if (!bVar1) break;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<rlottie::internal::model::Object_*const_*,_std::vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>_>_>
      ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<rlottie::internal::model::Object_*const_*,_std::vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>_>_>
                   *)in_stack_ffffffffffffffc0);
      in_stack_ffffffffffffffd0 =
           (vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
            *)createContentItem((Object *)content,in_stack_00000010);
      if (in_stack_ffffffffffffffd0 !=
          (vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
           *)0x0) {
        std::
        vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
        ::push_back((vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
                     *)in_stack_ffffffffffffffd0,(value_type *)in_RDI);
      }
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<rlottie::internal::model::Object_*const_*,_std::vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<rlottie::internal::model::Object_*const_*,_std::vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>_>_>
                    *)in_stack_ffffffffffffffc0);
    }
  }
  return;
}

Assistant:

void renderer::Group::addChildren(model::Group *data, VArenaAlloc *allocator)
{
    if (!data) return;

    if (!data->mChildren.empty()) mContents.reserve(data->mChildren.size());

    // keep the content in back-to-front order.
    // as lottie model keeps it in front-to-back order.
    for (auto it = data->mChildren.crbegin(); it != data->mChildren.rend();
         ++it) {
        auto content = createContentItem(*it, allocator);
        if (content) {
            mContents.push_back(content);
        }
    }
}